

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_print.cc
# Opt level: O1

int X509_NAME_print_ex_fp(FILE *fp,X509_NAME *nm,int indent,ulong flags)

{
  int iVar1;
  BIO *out;
  
  if (fp == (FILE *)0x0) {
    out = (BIO *)0x0;
  }
  else {
    out = BIO_new_fp(fp,0);
    if (out == (BIO *)0x0) {
      return -1;
    }
  }
  iVar1 = X509_NAME_print_ex(out,nm,indent,flags);
  BIO_free(out);
  return iVar1;
}

Assistant:

int X509_NAME_print_ex_fp(FILE *fp, const X509_NAME *nm, int indent,
                          unsigned long flags) {
  BIO *bio = NULL;
  if (fp != NULL) {
    // If |fp| is NULL, this function returns the number of bytes without
    // writing.
    bio = BIO_new_fp(fp, BIO_NOCLOSE);
    if (bio == NULL) {
      return -1;
    }
  }
  int ret = X509_NAME_print_ex(bio, nm, indent, flags);
  BIO_free(bio);
  return ret;
}